

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::setHessianBlock
          (MultipleShootingTranscription *this,MatrixDynSize *hessian,MatrixDynSize *block,
          size_t startRow,size_t startCol)

{
  bool *pbVar1;
  long lVar2;
  ulong uVar3;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_c0;
  Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_a0;
  Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>
  local_80;
  
  pbVar1 = HessianBlocksMap::operator()(&this->m_hessianBlocks,startRow,startCol);
  uVar3 = startCol & 0xffffffff;
  local_80.
  super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
  .m_startRow.m_value = startRow;
  local_80.
  super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
  .m_startCol.m_value = uVar3;
  if (*pbVar1 == true) {
    toEigen(&local_a0,block);
    toEigen(&local_c0,hessian);
    lVar2 = iDynTree::MatrixDynSize::rows();
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_cols.m_value = iDynTree::MatrixDynSize::cols();
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_data = local_c0.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data + uVar3 + local_c0.
                                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                .
                                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                .m_cols.m_value * startRow;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = local_c0.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value =
         local_c0.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value =
         local_c0.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_outerStride =
         local_c0.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_rows.m_value = lVar2;
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>>
    ::operator+=((MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>>
                  *)&local_80,
                 (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_a0);
  }
  else {
    toEigen(&local_a0,block);
    toEigen(&local_c0,hessian);
    lVar2 = iDynTree::MatrixDynSize::rows();
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_cols.m_value = iDynTree::MatrixDynSize::cols();
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_data = local_c0.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data + uVar3 + local_c0.
                                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                .
                                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                .m_cols.m_value * startRow;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = local_c0.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value =
         local_c0.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value =
         local_c0.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .m_outerStride =
         local_c0.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    local_80.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_rows.m_value = lVar2;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>>
              (&local_80,&local_a0);
    pbVar1 = HessianBlocksMap::operator()(&this->m_hessianBlocks,startRow,startCol);
    *pbVar1 = true;
  }
  return;
}

Assistant:

void setHessianBlock(MatrixDynSize& hessian, const MatrixDynSize& block, size_t startRow, size_t startCol) {
                if (m_hessianBlocks(startRow, startCol)) {
                    toEigen(hessian).block(static_cast<Eigen::Index>(startRow), static_cast<unsigned int>(startCol), block.rows(), block.cols()) += toEigen(block);
                } else {
                    toEigen(hessian).block(static_cast<Eigen::Index>(startRow), static_cast<unsigned int>(startCol), block.rows(), block.cols()) = toEigen(block);
                    m_hessianBlocks(startRow, startCol) = true;
                }
            }